

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_Update_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Entity_State_Update_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Entity_State_Update_PDU *this)

{
  pointer pKVar1;
  KString *pKVar2;
  ostream *poVar3;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  pointer pKVar4;
  KStringStream ss;
  KString local_280;
  KString local_260;
  KString *local_240;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_280,&this->super_Header);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_280._M_dataplus._M_p,local_280._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-Entity State Update PDU-\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Entity ID:\n",0xb);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_EntityID);
  UTILS::IndentString(&local_260,&local_1d8,Tabs,in_CL);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_260._M_dataplus._M_p,local_260._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Number Of Variable Params:      ",0x20)
  ;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Linear Velocity:                ",0x20)
  ;
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_1f8,&this->m_EntityLinearVelocity);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Entity Location:                ",0x20)
  ;
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_218,&this->m_EntityLocation);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Entity Orientation:             ",0x20)
  ;
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_238,&this->m_EntityOrientation);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_238._M_dataplus._M_p,local_238._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  local_240 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  pKVar4 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar1 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pKVar4 != pKVar1) {
    do {
      (*(pKVar4->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_260);
      UTILS::IndentString(&local_280,&local_260,Tabs_00,in_CL);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_280._M_dataplus._M_p,local_280._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      pKVar4 = pKVar4 + 1;
    } while (pKVar4 != pKVar1);
  }
  pKVar2 = local_240;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar2;
}

Assistant:

KString Entity_State_Update_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Entity State Update PDU-\n"
       << "Entity ID:\n"
       << IndentString( m_EntityID.GetAsString(), 1 )
       << "Number Of Variable Params:      " << ( KUINT16 )m_ui8NumOfVariableParams << "\n"
       << "Linear Velocity:                " << m_EntityLinearVelocity.GetAsString()
       << "Entity Location:                " << m_EntityLocation.GetAsString()
       << "Entity Orientation:             " << m_EntityOrientation.GetAsString();
    // We can not print the entity appearance as we do not have the entity type.

    // Variable params
    vector<VarPrmPtr>::const_iterator citr = m_vVariableParameters.begin();
    vector<VarPrmPtr>::const_iterator citrEnd = m_vVariableParameters.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ss << IndentString( ( *citr )->GetAsString(), 1 );
    }

    return ss.str();
}